

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  long *plVar2;
  uint uVar3;
  size_t ilhs;
  ulong uVar4;
  MatchResultListener *pMVar5;
  ulong uVar6;
  bool bVar7;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  char *local_80;
  char *local_78;
  ulong local_70;
  _Vector_base<char,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  local_50 = element_printouts;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_48,*(size_type *)matrix,
             (value_type *)&local_68,(allocator_type *)&local_78);
  local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_68,*(size_type *)(matrix + 8),
             (value_type *)&local_78,(allocator_type *)&local_80);
  for (uVar4 = 0; uVar4 < *(ulong *)matrix; uVar4 = uVar4 + 1) {
    for (uVar6 = 0; uVar6 < *(ulong *)(matrix + 8); uVar6 = uVar6 + 1) {
      bVar7 = *(char *)(uVar6 + *(ulong *)(matrix + 8) * uVar4 + *(long *)(matrix + 0x10)) == '\x01'
      ;
      local_48._M_impl.super__Vector_impl_data._M_start[uVar4] =
           local_48._M_impl.super__Vector_impl_data._M_start[uVar4] | bVar7;
      pbVar1 = (byte *)(CONCAT71(local_68._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_68._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar6);
      *pbVar1 = *pbVar1 | bVar7;
    }
  }
  uVar3 = *(uint *)this;
  bVar7 = true;
  if ((uVar3 & 1) != 0) {
    local_78 = "where the following matchers don\'t match any elements:\n";
    bVar7 = true;
    local_80 = (char *)0x0;
    while( true ) {
      if (local_68._M_impl.super__Vector_impl_data._M_finish +
          -CONCAT71(local_68._M_impl.super__Vector_impl_data._M_start._1_7_,
                    local_68._M_impl.super__Vector_impl_data._M_start._0_1_) <= local_80) break;
      if (local_80[CONCAT71(local_68._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_68._M_impl.super__Vector_impl_data._M_start._0_1_)] == '\0') {
        if (listener->stream_ != (ostream *)0x0) {
          pMVar5 = MatchResultListener::operator<<(listener,&local_78);
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x15ef3e);
          pMVar5 = MatchResultListener::operator<<(pMVar5,(unsigned_long *)&local_80);
          MatchResultListener::operator<<(pMVar5,(char (*) [3])0x15cb63);
          plVar2 = *(long **)(*(long *)(this + 8) + (long)local_80 * 8);
          (**(code **)(*plVar2 + 0x10))(plVar2,listener->stream_);
          local_78 = ",\n";
        }
        bVar7 = false;
      }
      local_80 = local_80 + 1;
    }
    uVar3 = *(uint *)this;
  }
  if ((uVar3 & 2) != 0) {
    local_80 = "\nand ";
    if (bVar7) {
      local_80 = "";
    }
    local_78 = "where the following elements don\'t match any matchers:\n";
    local_70 = 0;
    while( true ) {
      if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48._M_impl.super__Vector_impl_data._M_start) <= local_70) break;
      if (local_48._M_impl.super__Vector_impl_data._M_start[local_70] == '\0') {
        if (listener->stream_ != (ostream *)0x0) {
          pMVar5 = MatchResultListener::operator<<(listener,&local_80);
          pMVar5 = MatchResultListener::operator<<(pMVar5,&local_78);
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x15ecff);
          pMVar5 = MatchResultListener::operator<<(pMVar5,&local_70);
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x15cb63);
          MatchResultListener::operator<<
                    (pMVar5,(local_50->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + local_70);
          local_78 = ",\n";
          local_80 = "";
        }
        bVar7 = false;
      }
      local_70 = local_70 + 1;
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  return bVar7;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}